

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O3

mecab_node_t * __thiscall
MeCab::Tokenizer<mecab_node_t,_mecab_path_t>::lookup<true>
          (Tokenizer<mecab_node_t,_mecab_path_t> *this,char *begin,char *end,
          Allocator<mecab_node_t,_mecab_path_t> *allocator,Lattice *lattice)

{
  Token *pTVar1;
  char *pcVar2;
  pointer ppVar3;
  short sVar4;
  Lattice *pLVar5;
  Allocator<mecab_node_t,_mecab_path_t> *pAVar6;
  bool bVar7;
  unsigned_short uVar8;
  int iVar9;
  CharInfo CVar10;
  CharInfo CVar11;
  uint uVar12;
  CharInfo CVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  mecab_node_t *pmVar14;
  mecab_node_t *pmVar15;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ostream *poVar16;
  pointer ppDVar17;
  result_pair_type *prVar18;
  result_pair_type *prVar19;
  result_pair_type *prVar20;
  Tokenizer<mecab_node_t,_mecab_path_t> *pTVar21;
  ulong uVar22;
  size_t sVar23;
  long lVar24;
  uint *puVar25;
  result_pair_type *prVar26;
  result_pair_type *prVar27;
  undefined1 auVar28 [16];
  size_t mblen;
  mecab_node_t *local_c0;
  die local_a9;
  result_pair_type *local_a8;
  Tokenizer<mecab_node_t,_mecab_path_t> *local_a0;
  result_pair_type *local_98;
  result_pair_type *local_90;
  size_t local_88;
  Lattice *local_80;
  Allocator<mecab_node_t,_mecab_path_t> *local_78;
  char *local_70;
  result_pair_type *local_68;
  result_pair_type *local_60;
  CharProperty *local_58;
  undefined8 local_50;
  size_t local_48;
  size_t local_40;
  ulong local_38;
  
  local_88 = 0;
  prVar18 = (result_pair_type *)(begin + 0xffff);
  if ((ulong)((long)end - (long)begin) < 0xffff) {
    prVar18 = (result_pair_type *)end;
  }
  local_78 = allocator;
  iVar9 = (*lattice->_vptr_Lattice[8])(lattice);
  uVar22 = (long)begin - CONCAT44(extraout_var,iVar9);
  do {
    uVar22 = uVar22 + 1;
    iVar9 = (*lattice->_vptr_Lattice[0xb])(lattice);
    if (CONCAT44(extraout_var_00,iVar9) <= uVar22) goto LAB_00125e99;
    iVar9 = (*lattice->_vptr_Lattice[0x1f])(lattice,uVar22);
  } while (iVar9 != 1);
  iVar9 = (*lattice->_vptr_Lattice[8])(lattice);
  prVar18 = (result_pair_type *)(CONCAT44(extraout_var_01,iVar9) + uVar22);
LAB_00125e99:
  local_58 = &this->property_;
  prVar20 = (result_pair_type *)begin;
  local_80 = lattice;
  if (prVar18 == (result_pair_type *)begin) {
    CVar10 = (CharInfo)0x0;
  }
  else {
    CVar13 = this->space_;
    do {
      CVar10 = CharProperty::getCharInfo(local_58,(char *)prVar20,(char *)prVar18,&local_88);
      if (((uint)CVar13 & (uint)CVar10 & 0x3ffff) == 0) break;
      prVar20 = (result_pair_type *)((long)&prVar20->value + local_88);
      CVar13 = CVar10;
    } while (prVar20 != prVar18);
  }
  ppDVar17 = (this->dic_).
             super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_a0 = this;
  local_70 = begin;
  local_68 = prVar18;
  if (ppDVar17 ==
      (this->dic_).super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_c0 = (mecab_node_t *)0x0;
  }
  else {
    prVar19 = (local_78->results_).ptr_;
    local_50 = (long)prVar18 - (long)prVar20;
    local_90 = (result_pair_type *)((long)prVar20 - (long)begin);
    local_98 = (result_pair_type *)CONCAT44(local_98._4_4_,(uint)CVar10 >> 0x12);
    local_c0 = (mecab_node_t *)0x0;
    local_60 = prVar19;
    do {
      local_48 = Darts::
                 DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>::
                 commonPrefixSearch<MeCab::Darts::DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>::result_pair_type>
                           ((DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>
                             *)&(*ppDVar17)->da_,(key_type_conflict *)prVar20,prVar19,0x200,local_50
                            ,0);
      if (local_48 != 0) {
        sVar23 = 0;
        do {
          uVar12 = prVar19[sVar23].value;
          local_40 = sVar23;
          if ((uVar12 & 0xff) != 0) {
            local_a8 = prVar19 + sVar23;
            iVar9 = (int)uVar12 >> 8;
            pTVar1 = (*ppDVar17)->token_;
            uVar22 = 0;
            do {
              pAVar6 = local_78;
              pmVar14 = FreeList<mecab_node_t>::alloc((local_78->node_freelist_).ptr_);
              pmVar14->prev = (mecab_node_t *)0x0;
              pmVar14->next = (mecab_node_t *)0x0;
              pmVar14->enext = (mecab_node_t *)0x0;
              pmVar14->bnext = (mecab_node_t *)0x0;
              pmVar14->rpath = (mecab_path_t *)0x0;
              pmVar14->lpath = (mecab_path_t *)0x0;
              pmVar14->surface = (char *)0x0;
              pmVar14->feature = (char *)0x0;
              pmVar14->id = 0;
              pmVar14->length = 0;
              pmVar14->rlength = 0;
              pmVar14->rcAttr = 0;
              pmVar14->lcAttr = 0;
              pmVar14->posid = 0;
              pmVar14->char_type = '\0';
              pmVar14->stat = '\0';
              pmVar14->isbest = '\0';
              *(undefined3 *)&pmVar14->field_0x51 = 0;
              pmVar14->alpha = 0.0;
              pmVar14->beta = 0.0;
              pmVar14->prob = 0.0;
              *(undefined8 *)&pmVar14->wcost = 0;
              pmVar14->cost = 0;
              sVar23 = pAVar6->id_;
              pAVar6->id_ = sVar23 + 1;
              pmVar14->id = (uint)sVar23;
              pcVar2 = (*ppDVar17)->feature_;
              auVar28 = ZEXT416(*(uint *)((long)&pTVar1[iVar9].lcAttr + uVar22));
              auVar28 = pshuflw(auVar28,auVar28,0xe1);
              pmVar14->rcAttr = (short)auVar28._0_4_;
              pmVar14->lcAttr = (short)((uint)auVar28._0_4_ >> 0x10);
              pmVar14->posid = *(unsigned_short *)((long)&pTVar1[iVar9].posid + uVar22);
              pmVar14->wcost = *(short *)((long)&pTVar1[iVar9].wcost + uVar22);
              pmVar14->feature = pcVar2 + *(uint *)((long)&pTVar1[iVar9].feature + uVar22);
              uVar8 = (unsigned_short)local_a8->length;
              pmVar14->length = uVar8;
              pmVar14->rlength = uVar8 + (short)local_90;
              pmVar14->surface = (char *)prVar20;
              pmVar14->char_type = (uchar)local_98;
              bVar7 = anon_unknown_21::is_valid_node<mecab_node_t>(local_80,pmVar14);
              if (bVar7) {
                pmVar14->bnext = local_c0;
                local_c0 = pmVar14;
              }
              uVar22 = uVar22 + 0x10;
            } while ((uVar12 & 0xff) << 4 != uVar22);
          }
          sVar23 = local_40 + 1;
          prVar19 = local_60;
        } while (sVar23 != local_48);
      }
      ppDVar17 = ppDVar17 + 1;
    } while (ppDVar17 !=
             (local_a0->dic_).
             super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
    if ((-1 < (int)CVar10) && (local_c0 != (mecab_node_t *)0x0)) {
      return local_c0;
    }
  }
  local_a8 = (result_pair_type *)local_88;
  prVar18 = (result_pair_type *)((long)&prVar20->value + local_88);
  if (local_68 < prVar18) {
    ppVar3 = (local_a0->unk_tokens_).
             super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar22 = (ulong)((uint)CVar10 >> 0xe & 0xff0);
    lVar24 = *(long *)((long)&ppVar3->second + uVar22);
    local_98 = prVar18;
    if (lVar24 != 0) {
      local_90 = (result_pair_type *)CONCAT44(local_90._4_4_,(uint)CVar10 >> 0x12);
      sVar4 = (short)local_70;
      puVar25 = (uint *)(*(long *)((long)&ppVar3->first + uVar22) + 8);
      do {
        pAVar6 = local_78;
        pmVar14 = FreeList<mecab_node_t>::alloc((local_78->node_freelist_).ptr_);
        pmVar14->prev = (mecab_node_t *)0x0;
        pmVar14->next = (mecab_node_t *)0x0;
        pmVar14->enext = (mecab_node_t *)0x0;
        pmVar14->bnext = (mecab_node_t *)0x0;
        pmVar14->rpath = (mecab_path_t *)0x0;
        pmVar14->lpath = (mecab_path_t *)0x0;
        pmVar14->surface = (char *)0x0;
        pmVar14->feature = (char *)0x0;
        pmVar14->id = 0;
        pmVar14->length = 0;
        pmVar14->rlength = 0;
        pmVar14->rcAttr = 0;
        pmVar14->lcAttr = 0;
        pmVar14->posid = 0;
        pmVar14->char_type = '\0';
        pmVar14->stat = '\0';
        pmVar14->isbest = '\0';
        *(undefined3 *)&pmVar14->field_0x51 = 0;
        pmVar14->alpha = 0.0;
        pmVar14->beta = 0.0;
        pmVar14->prob = 0.0;
        pmVar14->wcost = 0;
        *(undefined6 *)&pmVar14->field_0x62 = 0;
        pmVar14->cost = 0;
        sVar23 = pAVar6->id_;
        pAVar6->id_ = sVar23 + 1;
        pmVar14->id = (uint)sVar23;
        pcVar2 = (local_a0->unkdic_).feature_;
        auVar28 = pshuflw(ZEXT416(puVar25[-2]),ZEXT416(puVar25[-2]),0xe1);
        pmVar14->rcAttr = (short)auVar28._0_4_;
        pmVar14->lcAttr = (short)((uint)auVar28._0_4_ >> 0x10);
        pmVar14->posid = (unsigned_short)puVar25[-1];
        pmVar14->wcost = *(short *)((long)puVar25 + -2);
        pmVar14->feature = pcVar2 + *puVar25;
        pmVar14->char_type = (uchar)local_90;
        pmVar14->surface = (char *)prVar20;
        pmVar14->length = (unsigned_short)local_a8;
        pmVar14->rlength = (short)prVar18 - sVar4;
        pmVar14->stat = '\x01';
        pmVar14->bnext = local_c0;
        pcVar2 = (local_a0->unk_feature_).super_scoped_array<char>.ptr_;
        if (pcVar2 != (char *)0x0) {
          pmVar14->feature = pcVar2;
        }
        bVar7 = anon_unknown_21::is_valid_node<mecab_node_t>(local_80,pmVar14);
        if (bVar7) {
          local_c0 = pmVar14;
        }
        puVar25 = puVar25 + 4;
        lVar24 = lVar24 + -1;
      } while (lVar24 != 0);
    }
    if (local_c0 != (mecab_node_t *)0x0) {
      return local_c0;
    }
    local_c0 = (mecab_node_t *)0x0;
    prVar18 = local_98;
  }
  prVar19 = local_68;
  pTVar21 = local_a0;
  iVar9 = (int)prVar20;
  if (((uint)CVar10 >> 0x1e & 1) == 0) {
    prVar27 = (result_pair_type *)0x0;
  }
  else {
    prVar26 = local_68;
    local_98 = prVar18;
    if (prVar18 != local_68) {
      uVar22 = 0;
      CVar13 = CVar10;
      do {
        CVar11 = CharProperty::getCharInfo(local_58,(char *)prVar18,(char *)prVar19,&local_88);
        prVar26 = prVar18;
        if (((uint)CVar13 & (uint)CVar11 & 0x3ffff) == 0) break;
        prVar18 = (result_pair_type *)((long)&prVar18->value + local_88);
        uVar22 = uVar22 + 1;
        prVar26 = prVar19;
        CVar13 = CVar11;
      } while (prVar18 != prVar19);
      prVar18 = local_98;
      prVar27 = prVar26;
      if (pTVar21->max_grouping_size_ < uVar22) goto LAB_00126433;
    }
    ppVar3 = (pTVar21->unk_tokens_).
             super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar22 = (ulong)((uint)CVar10 >> 0xe & 0xff0);
    lVar24 = *(long *)((long)&ppVar3->second + uVar22);
    prVar18 = local_98;
    prVar27 = prVar26;
    if (lVar24 != 0) {
      local_a8 = (result_pair_type *)CONCAT44(local_a8._4_4_,(uint)CVar10 >> 0x12);
      local_90 = (result_pair_type *)CONCAT44(local_90._4_4_,(int)prVar26 - iVar9);
      sVar4 = (short)local_70;
      puVar25 = (uint *)(*(long *)((long)&ppVar3->first + uVar22) + 8);
      local_60 = prVar26;
      do {
        pAVar6 = local_78;
        pmVar14 = FreeList<mecab_node_t>::alloc((local_78->node_freelist_).ptr_);
        pmVar14->prev = (mecab_node_t *)0x0;
        pmVar14->next = (mecab_node_t *)0x0;
        pmVar14->enext = (mecab_node_t *)0x0;
        pmVar14->bnext = (mecab_node_t *)0x0;
        pmVar14->rpath = (mecab_path_t *)0x0;
        pmVar14->lpath = (mecab_path_t *)0x0;
        pmVar14->surface = (char *)0x0;
        pmVar14->feature = (char *)0x0;
        pmVar14->id = 0;
        pmVar14->length = 0;
        pmVar14->rlength = 0;
        pmVar14->rcAttr = 0;
        pmVar14->lcAttr = 0;
        pmVar14->posid = 0;
        pmVar14->char_type = '\0';
        pmVar14->stat = '\0';
        pmVar14->isbest = '\0';
        *(undefined3 *)&pmVar14->field_0x51 = 0;
        pmVar14->alpha = 0.0;
        pmVar14->beta = 0.0;
        pmVar14->prob = 0.0;
        pmVar14->wcost = 0;
        *(undefined6 *)&pmVar14->field_0x62 = 0;
        pmVar14->cost = 0;
        sVar23 = pAVar6->id_;
        pAVar6->id_ = sVar23 + 1;
        pmVar14->id = (uint)sVar23;
        pcVar2 = (local_a0->unkdic_).feature_;
        auVar28 = pshuflw(ZEXT416(puVar25[-2]),ZEXT416(puVar25[-2]),0xe1);
        pmVar14->rcAttr = (short)auVar28._0_4_;
        pmVar14->lcAttr = (short)((uint)auVar28._0_4_ >> 0x10);
        pmVar14->posid = (unsigned_short)puVar25[-1];
        pmVar14->wcost = *(short *)((long)puVar25 + -2);
        pmVar14->feature = pcVar2 + *puVar25;
        pmVar14->char_type = (uchar)local_a8;
        pmVar14->surface = (char *)prVar20;
        pmVar14->length = (unsigned_short)local_90;
        pmVar14->rlength = (short)prVar26 - sVar4;
        pmVar14->stat = '\x01';
        pmVar14->bnext = local_c0;
        pcVar2 = (local_a0->unk_feature_).super_scoped_array<char>.ptr_;
        if (pcVar2 != (char *)0x0) {
          pmVar14->feature = pcVar2;
        }
        bVar7 = anon_unknown_21::is_valid_node<mecab_node_t>(local_80,pmVar14);
        if (bVar7) {
          local_c0 = pmVar14;
        }
        puVar25 = puVar25 + 4;
        lVar24 = lVar24 + -1;
        prVar18 = local_98;
        pTVar21 = local_a0;
        prVar19 = local_68;
        prVar27 = local_60;
      } while (lVar24 != 0);
    }
  }
LAB_00126433:
  uVar12 = (uint)CVar10 >> 0x1a & 0xf;
  local_48 = (size_t)uVar12;
  if ((uVar12 != 0) && (prVar18 <= prVar19)) {
    local_90 = (result_pair_type *)CONCAT44(local_90._4_4_,(uint)CVar10 >> 0x12);
    local_50 = CONCAT44(local_50._4_4_,CVar10) & 0xffffffff0003ffff;
    sVar23 = 1;
    uVar22 = (ulong)(((uint)CVar10 >> 0x12 & 0xff) << 4);
    local_60 = prVar27;
    local_38 = uVar22;
    do {
      if (prVar18 != prVar27) {
        ppVar3 = (pTVar21->unk_tokens_).
                 super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar24 = *(long *)((long)&ppVar3->second + uVar22);
        local_98 = prVar18;
        local_40 = sVar23;
        if (lVar24 != 0) {
          local_a8 = (result_pair_type *)CONCAT44(local_a8._4_4_,(int)prVar18 - iVar9);
          sVar4 = (short)local_70;
          puVar25 = (uint *)(*(long *)((long)&ppVar3->first + uVar22) + 8);
          do {
            pAVar6 = local_78;
            pmVar14 = FreeList<mecab_node_t>::alloc((local_78->node_freelist_).ptr_);
            pmVar14->prev = (mecab_node_t *)0x0;
            pmVar14->next = (mecab_node_t *)0x0;
            pmVar14->enext = (mecab_node_t *)0x0;
            pmVar14->bnext = (mecab_node_t *)0x0;
            pmVar14->rpath = (mecab_path_t *)0x0;
            pmVar14->lpath = (mecab_path_t *)0x0;
            pmVar14->surface = (char *)0x0;
            pmVar14->feature = (char *)0x0;
            pmVar14->id = 0;
            pmVar14->length = 0;
            pmVar14->rlength = 0;
            pmVar14->rcAttr = 0;
            pmVar14->lcAttr = 0;
            pmVar14->posid = 0;
            pmVar14->char_type = '\0';
            pmVar14->stat = '\0';
            pmVar14->isbest = '\0';
            *(undefined3 *)&pmVar14->field_0x51 = 0;
            pmVar14->alpha = 0.0;
            pmVar14->beta = 0.0;
            pmVar14->prob = 0.0;
            pmVar14->wcost = 0;
            *(undefined6 *)&pmVar14->field_0x62 = 0;
            pmVar14->cost = 0;
            sVar23 = pAVar6->id_;
            pAVar6->id_ = sVar23 + 1;
            pmVar14->id = (uint)sVar23;
            pcVar2 = (local_a0->unkdic_).feature_;
            auVar28 = pshuflw(ZEXT416(puVar25[-2]),ZEXT416(puVar25[-2]),0xe1);
            pmVar14->rcAttr = (short)auVar28._0_4_;
            pmVar14->lcAttr = (short)((uint)auVar28._0_4_ >> 0x10);
            pmVar14->posid = (unsigned_short)puVar25[-1];
            pmVar14->wcost = *(short *)((long)puVar25 + -2);
            pmVar14->feature = pcVar2 + *puVar25;
            pmVar14->char_type = (uchar)local_90;
            pmVar14->surface = (char *)prVar20;
            pmVar14->length = (unsigned_short)local_a8;
            pmVar14->rlength = (short)prVar18 - sVar4;
            pmVar14->stat = '\x01';
            pmVar14->bnext = local_c0;
            pcVar2 = (local_a0->unk_feature_).super_scoped_array<char>.ptr_;
            if (pcVar2 != (char *)0x0) {
              pmVar14->feature = pcVar2;
            }
            bVar7 = anon_unknown_21::is_valid_node<mecab_node_t>(local_80,pmVar14);
            if (bVar7) {
              local_c0 = pmVar14;
            }
            puVar25 = puVar25 + 4;
            lVar24 = lVar24 + -1;
          } while (lVar24 != 0);
        }
        prVar19 = local_68;
        prVar18 = local_98;
        CVar13 = CharProperty::getCharInfo(local_58,(char *)local_98,(char *)local_68,&local_88);
        pTVar21 = local_a0;
        if (((uint)local_50 & (uint)CVar13) == 0) break;
        prVar18 = (result_pair_type *)((long)&prVar18->value + local_88);
        uVar22 = local_38;
        sVar23 = local_40;
        prVar27 = local_60;
      }
      if ((local_48 <= sVar23) || (sVar23 = sVar23 + 1, prVar19 < prVar18)) break;
    } while( true );
  }
  pAVar6 = local_78;
  pLVar5 = local_80;
  if (local_c0 == (mecab_node_t *)0x0) {
    ppVar3 = (pTVar21->unk_tokens_).
             super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar22 = (ulong)((uint)CVar10 >> 0xe & 0xff0);
    lVar24 = *(long *)((long)&ppVar3->second + uVar22);
    if (lVar24 != 0) {
      local_a8 = (result_pair_type *)CONCAT44(local_a8._4_4_,(int)prVar18 - iVar9);
      local_98 = (result_pair_type *)(ulong)(uint)((int)prVar18 - (int)local_70);
      puVar25 = (uint *)(*(long *)((long)&ppVar3->first + uVar22) + 8);
      pmVar14 = (mecab_node_t *)0x0;
      do {
        pmVar15 = FreeList<mecab_node_t>::alloc((pAVar6->node_freelist_).ptr_);
        pmVar15->prev = (mecab_node_t *)0x0;
        pmVar15->next = (mecab_node_t *)0x0;
        pmVar15->enext = (mecab_node_t *)0x0;
        pmVar15->bnext = (mecab_node_t *)0x0;
        pmVar15->rpath = (mecab_path_t *)0x0;
        pmVar15->lpath = (mecab_path_t *)0x0;
        pmVar15->surface = (char *)0x0;
        pmVar15->feature = (char *)0x0;
        pmVar15->id = 0;
        pmVar15->length = 0;
        pmVar15->rlength = 0;
        pmVar15->rcAttr = 0;
        pmVar15->lcAttr = 0;
        pmVar15->posid = 0;
        pmVar15->char_type = '\0';
        pmVar15->stat = '\0';
        pmVar15->isbest = '\0';
        *(undefined3 *)&pmVar15->field_0x51 = 0;
        pmVar15->alpha = 0.0;
        pmVar15->beta = 0.0;
        pmVar15->prob = 0.0;
        pmVar15->wcost = 0;
        *(undefined6 *)&pmVar15->field_0x62 = 0;
        pmVar15->cost = 0;
        sVar23 = pAVar6->id_;
        pAVar6->id_ = sVar23 + 1;
        pmVar15->id = (uint)sVar23;
        pcVar2 = (local_a0->unkdic_).feature_;
        auVar28 = pshuflw(ZEXT416(puVar25[-2]),ZEXT416(puVar25[-2]),0xe1);
        pmVar15->rcAttr = (short)auVar28._0_4_;
        pmVar15->lcAttr = (short)((uint)auVar28._0_4_ >> 0x10);
        pmVar15->posid = (unsigned_short)puVar25[-1];
        pmVar15->wcost = *(short *)((long)puVar25 + -2);
        pmVar15->feature = pcVar2 + *puVar25;
        pmVar15->char_type = (uchar)((uint)CVar10 >> 0x12);
        pmVar15->surface = (char *)prVar20;
        pmVar15->length = (unsigned_short)local_a8;
        pmVar15->rlength = (unsigned_short)local_98;
        pmVar15->stat = '\x01';
        pmVar15->bnext = pmVar14;
        pcVar2 = (local_a0->unk_feature_).super_scoped_array<char>.ptr_;
        if (pcVar2 != (char *)0x0) {
          pmVar15->feature = pcVar2;
        }
        bVar7 = anon_unknown_21::is_valid_node<mecab_node_t>(pLVar5,pmVar15);
        if (bVar7) {
          pmVar14 = pmVar15;
        }
        puVar25 = puVar25 + 4;
        lVar24 = lVar24 + -1;
      } while (lVar24 != 0);
      pTVar21 = local_a0;
      if (pmVar14 != (mecab_node_t *)0x0) {
        return pmVar14;
      }
    }
    prVar18 = local_68;
    pLVar5 = local_80;
    prVar19 = prVar20;
    do {
      CVar10 = CharProperty::getCharInfo(local_58,(char *)prVar19,(char *)prVar18,&local_88);
      prVar19 = (result_pair_type *)((long)&prVar19->value + local_88);
      if (prVar18 < prVar19) break;
      iVar9 = (*pLVar5->_vptr_Lattice[8])(pLVar5);
      iVar9 = (*pLVar5->_vptr_Lattice[0x1f])(pLVar5,(long)prVar19 - CONCAT44(extraout_var_02,iVar9))
      ;
    } while (iVar9 == 2);
    pAVar6 = local_78;
    local_a8 = (result_pair_type *)CONCAT44(local_a8._4_4_,(uint)CVar10 >> 0x12);
    ppVar3 = (pTVar21->unk_tokens_).
             super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar22 = (ulong)((uint)CVar10 >> 0xe & 0xff0);
    lVar24 = *(long *)((long)&ppVar3->second + uVar22);
    local_90 = prVar19;
    if (lVar24 != 0) {
      sVar4 = (short)local_70;
      puVar25 = (uint *)(*(long *)((long)&ppVar3->first + uVar22) + 8);
      pmVar14 = (mecab_node_t *)0x0;
      do {
        pmVar15 = FreeList<mecab_node_t>::alloc((pAVar6->node_freelist_).ptr_);
        pmVar15->prev = (mecab_node_t *)0x0;
        pmVar15->next = (mecab_node_t *)0x0;
        pmVar15->enext = (mecab_node_t *)0x0;
        pmVar15->bnext = (mecab_node_t *)0x0;
        pmVar15->rpath = (mecab_path_t *)0x0;
        pmVar15->lpath = (mecab_path_t *)0x0;
        pmVar15->surface = (char *)0x0;
        pmVar15->feature = (char *)0x0;
        pmVar15->id = 0;
        pmVar15->length = 0;
        pmVar15->rlength = 0;
        pmVar15->rcAttr = 0;
        pmVar15->lcAttr = 0;
        pmVar15->posid = 0;
        pmVar15->char_type = '\0';
        pmVar15->stat = '\0';
        pmVar15->isbest = '\0';
        *(undefined3 *)&pmVar15->field_0x51 = 0;
        pmVar15->alpha = 0.0;
        pmVar15->beta = 0.0;
        pmVar15->prob = 0.0;
        pmVar15->wcost = 0;
        *(undefined6 *)&pmVar15->field_0x62 = 0;
        pmVar15->cost = 0;
        sVar23 = pAVar6->id_;
        pAVar6->id_ = sVar23 + 1;
        pmVar15->id = (uint)sVar23;
        pcVar2 = (local_a0->unkdic_).feature_;
        auVar28 = pshuflw(ZEXT416(puVar25[-2]),ZEXT416(puVar25[-2]),0xe1);
        pmVar15->rcAttr = (short)auVar28._0_4_;
        pmVar15->lcAttr = (short)((uint)auVar28._0_4_ >> 0x10);
        pmVar15->posid = (unsigned_short)puVar25[-1];
        pmVar15->wcost = *(short *)((long)puVar25 + -2);
        pmVar15->feature = pcVar2 + *puVar25;
        pmVar15->char_type = (uchar)local_a8;
        pmVar15->surface = (char *)prVar20;
        pmVar15->length = (short)prVar19 - (short)prVar20;
        pmVar15->rlength = (short)prVar19 - sVar4;
        pmVar15->stat = '\x01';
        pmVar15->bnext = pmVar14;
        pcVar2 = (local_a0->unk_feature_).super_scoped_array<char>.ptr_;
        if (pcVar2 != (char *)0x0) {
          pmVar15->feature = pcVar2;
        }
        bVar7 = anon_unknown_21::is_valid_node<mecab_node_t>(local_80,pmVar15);
        if (bVar7) {
          pmVar14 = pmVar15;
        }
        puVar25 = puVar25 + 4;
        lVar24 = lVar24 + -1;
      } while (lVar24 != 0);
      if (pmVar14 != (mecab_node_t *)0x0) {
        return pmVar14;
      }
    }
    pAVar6 = local_78;
    local_c0 = FreeList<mecab_node_t>::alloc((local_78->node_freelist_).ptr_);
    pcVar2 = local_70;
    pLVar5 = local_80;
    local_c0->prev = (mecab_node_t *)0x0;
    local_c0->next = (mecab_node_t *)0x0;
    local_c0->enext = (mecab_node_t *)0x0;
    local_c0->bnext = (mecab_node_t *)0x0;
    local_c0->rpath = (mecab_path_t *)0x0;
    local_c0->lpath = (mecab_path_t *)0x0;
    local_c0->surface = (char *)0x0;
    local_c0->feature = (char *)0x0;
    local_c0->id = 0;
    local_c0->length = 0;
    local_c0->rlength = 0;
    local_c0->rcAttr = 0;
    local_c0->lcAttr = 0;
    local_c0->posid = 0;
    local_c0->char_type = '\0';
    local_c0->stat = '\0';
    local_c0->isbest = '\0';
    *(undefined3 *)&local_c0->field_0x51 = 0;
    local_c0->alpha = 0.0;
    local_c0->beta = 0.0;
    local_c0->prob = 0.0;
    local_c0->wcost = 0;
    *(undefined6 *)&local_c0->field_0x62 = 0;
    local_c0->cost = 0;
    sVar23 = pAVar6->id_;
    pAVar6->id_ = sVar23 + 1;
    local_c0->id = (uint)sVar23;
    local_c0->char_type = (uchar)local_a8;
    local_c0->surface = (char *)prVar20;
    local_c0->length = (short)local_90 - (short)prVar20;
    local_c0->rlength = (short)local_90 - (short)local_70;
    local_c0->stat = '\x01';
    iVar9 = (*local_80->_vptr_Lattice[8])(local_80);
    iVar9 = (*pLVar5->_vptr_Lattice[0x20])(pLVar5,(long)pcVar2 - CONCAT44(extraout_var_03,iVar9));
    local_c0->feature = (char *)CONCAT44(extraout_var_04,iVar9);
    if ((char *)CONCAT44(extraout_var_04,iVar9) == (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                 ,0x6f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
      poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x171);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"new_node->feature",0x11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"] ",2);
      die::~die(&local_a9);
    }
  }
  return local_c0;
}

Assistant:

N *Tokenizer<N, P>::lookup(const char *begin, const char *end,
                           Allocator<N, P> *allocator, Lattice *lattice) const {
  CharInfo cinfo;
  N *result_node = 0;
  size_t mblen = 0;
  size_t clen = 0;

  end = static_cast<size_t>(end - begin) >= 65535 ? begin + 65535 : end;

  if (isPartial) {
    const size_t begin_pos = begin - lattice->sentence();
    for (size_t n = begin_pos + 1; n < lattice->size(); ++n) {
      if (lattice->boundary_constraint(n) == MECAB_TOKEN_BOUNDARY) {
        end = lattice->sentence() + n;
        break;
      }
    }
  }

  const char *begin2 = property_.seekToOtherType(begin, end, space_,
                                                 &cinfo, &mblen, &clen);

  Dictionary::result_type *daresults = allocator->mutable_results();
  const size_t results_size = allocator->results_size();

  for (std::vector<Dictionary *>::const_iterator it = dic_.begin();
       it != dic_.end(); ++it) {
    const size_t n = (*it)->commonPrefixSearch(
        begin2,
        static_cast<size_t>(end - begin2),
        daresults, results_size);

    for (size_t i = 0; i < n; ++i) {
      size_t size = (*it)->token_size(daresults[i]);
      const Token *token = (*it)->token(daresults[i]);
      for (size_t j = 0; j < size; ++j) {
        N *new_node = allocator->newNode();
        read_node_info(**it, *(token + j), &new_node);
        new_node->length = daresults[i].length;
        new_node->rlength = begin2 - begin + new_node->length;
        new_node->surface = begin2;
        new_node->stat = MECAB_NOR_NODE;
        new_node->char_type = cinfo.default_type;
        if (isPartial && !is_valid_node(lattice, new_node)) {
          continue;
        }
        new_node->bnext = result_node;
        result_node = new_node;
      }
    }
  }

  if (result_node && !cinfo.invoke) {
    return result_node;
  }

  const char *begin3 = begin2 + mblen;
  const char *group_begin3 = 0;

  if (begin3 > end) {
    ADDUNKNWON;
    if (result_node) {
    return result_node;
  }
  }

  if (cinfo.group) {
    const char *tmp = begin3;
    CharInfo fail;
    begin3 = property_.seekToOtherType(begin3, end, cinfo,
                                       &fail, &mblen, &clen);
    if (clen <= max_grouping_size_) {
      ADDUNKNWON;
    }
    group_begin3 = begin3;
    begin3 = tmp;
  }

  for (size_t i = 1; i <= cinfo.length; ++i) {
    if (begin3 > end) {
      break;
    }
    if (begin3 == group_begin3) {
      continue;
    }
    clen = i;
    ADDUNKNWON;
    if (!cinfo.isKindOf(property_.getCharInfo(begin3, end, &mblen))) {
      break;
    }
    begin3 += mblen;
  }

  if (!result_node) {
    ADDUNKNWON;
  }

  if (isPartial && !result_node) {
    begin3 = begin2;
    while (true) {
      cinfo = property_.getCharInfo(begin3, end, &mblen);
      begin3 += mblen;
      if (begin3 > end ||
          lattice->boundary_constraint(begin3 - lattice->sentence())
          != MECAB_INSIDE_TOKEN) {
        break;
      }
    }
    ADDUNKNWON;

    if (!result_node) {
      N *new_node = allocator->newNode();
      new_node->char_type = cinfo.default_type;
      new_node->surface = begin2;
      new_node->length = begin3 - begin2;
      new_node->rlength = begin3 - begin;
      new_node->stat = MECAB_UNK_NODE;
      new_node->bnext = result_node;
      new_node->feature =
          lattice->feature_constraint(begin - lattice->sentence());
      CHECK_DIE(new_node->feature);
      result_node = new_node;
    }
  }

  return result_node;
}